

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

Color * __thiscall
World::getRadiance(Color *__return_storage_ptr__,World *this,Vector3 *P,Vector3 *N)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  Vector3 O;
  double local_68;
  Vector3 local_60;
  Vector3 local_48;
  
  iVar4 = this->SHADE_QUALITY;
  if (iVar4 < 0) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    iVar3 = -iVar4;
    do {
      iVar2 = this->SHADE_QUALITY;
      if (SBORROW4(iVar2,-iVar4) == iVar2 + iVar4 < 0) {
        iVar4 = -iVar4;
        do {
          Light::getPos(&local_60,this->light,(double)iVar3 / (double)iVar2,
                        (double)iVar4 / (double)iVar2);
          dVar5 = getRadianceWithLight(this,P,N,&local_60);
          dVar6 = dVar6 + dVar5;
          iVar2 = this->SHADE_QUALITY;
          bVar1 = iVar4 < iVar2;
          iVar4 = iVar4 + 1;
        } while (bVar1);
      }
      iVar4 = this->SHADE_QUALITY;
      bVar1 = iVar3 < iVar4;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  local_48.x = (double)(iVar4 * 2 + 1);
  local_48.x = (dVar6 / local_48.x) / local_48.x;
  local_48.y = local_48.x;
  local_48.z = local_48.x;
  operator*(&local_48,&this->light->color);
  local_68 = Vector3::power(&this->light->color);
  operator/(&local_60,&local_68);
  return __return_storage_ptr__;
}

Assistant:

Color World::getRadiance(const Vector3 &P, const Vector3 &N)
{
    double res = 0;
    for (int i = -SHADE_QUALITY; i <= SHADE_QUALITY; ++i) {
        for (int j = -SHADE_QUALITY; j <= SHADE_QUALITY; ++j) {
            Vector3 O = light->getPos(i*1.0/SHADE_QUALITY, j*1.0/SHADE_QUALITY);
            res += getRadianceWithLight(P, N, O);
        }
    }
    return res / (2 * SHADE_QUALITY + 1) / (2 * SHADE_QUALITY + 1) * light->color / light->color.power();
}